

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::~IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  void *pvVar1;
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  *this_00;
  long lVar2;
  pointer psVar3;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  pvVar1 = &this->field_0x0 + lVar2;
  this_00 = (vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>
                 ).field_0x10 + lVar2);
  this_00[-5].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__IfcPropertyEnumeratedValue_008fa1f0;
  this_00[1].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&PTR__IfcPropertyEnumeratedValue_008fa268;
  this_00[-2].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&PTR__IfcPropertyEnumeratedValue_008fa218;
  this_00[-1].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__IfcPropertyEnumeratedValue_008fa240;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(this_00);
  this_00[-5].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8fa380;
  this_00[1].
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(IfcProperty-in-Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::
                 construction_vtable + 0x40);
  psVar3 = this_00[-3].
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (pointer)(&this->field_0x40 + lVar2)) {
    operator_delete(psVar3);
  }
  if (*(void **)((long)pvVar1 + 0x10) != (void *)((long)pvVar1 + 0x20)) {
    operator_delete(*(void **)((long)pvVar1 + 0x10));
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}